

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::dispose
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this)

{
  Arg *firstElement;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar1;
  Arg *pAVar2;
  Arg *endCopy;
  Arg *posCopy;
  Arg *ptrCopy;
  ArrayBuilder<kj::MainBuilder::Impl::Arg> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pAVar2 = this->endPtr;
  if (firstElement != (Arg *)0x0) {
    this->ptr = (Arg *)0x0;
    this->pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
    this->endPtr = (Arg *)0x0;
    ArrayDisposer::dispose<kj::MainBuilder::Impl::Arg>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x28,
               ((long)pAVar2 - (long)firstElement) / 0x28);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }